

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O3

bool __thiscall APowerInvisibility::HandlePickup(APowerInvisibility *this,AInventory *item)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar5;
  APowerup *power;
  PClass *pPVar4;
  undefined4 extraout_var_00;
  
  if (((this->super_APowerup).Mode.super_FName.Index == 0x14) &&
     ((double)(this->super_APowerup).super_AInventory.super_AActor.special1 *
      (this->super_APowerup).Strength < 1.0)) {
    pPVar4 = (item->super_AActor).super_DThinker.super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar3 = (**(item->super_AActor).super_DThinker.super_DObject._vptr_DObject)(item);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
      (item->super_AActor).super_DThinker.super_DObject.Class = pPVar4;
    }
    pPVar5 = (this->super_APowerup).super_AInventory.super_AActor.super_DThinker.super_DObject.Class
    ;
    if (pPVar5 == (PClass *)0x0) {
      iVar3 = (**(this->super_APowerup).super_AInventory.super_AActor.super_DThinker.super_DObject.
                 _vptr_DObject)(this);
      pPVar5 = (PClass *)CONCAT44(extraout_var_00,iVar3);
      (this->super_APowerup).super_AInventory.super_AActor.super_DThinker.super_DObject.Class =
           pPVar5;
    }
    if (pPVar4 == pPVar5) {
      iVar3 = *(int *)&item->field_0x4fc;
      if (iVar3 != 0) {
        if (*(int *)&(this->super_APowerup).super_AInventory.field_0x4fc < iVar3) {
          *(int *)&(this->super_APowerup).super_AInventory.field_0x4fc = iVar3;
          (this->super_APowerup).BlendColor.field_0 =
               *(anon_union_4_2_12391d7c_for_PalEntry_0 *)(item + 1);
        }
        piVar1 = &(this->super_APowerup).super_AInventory.super_AActor.special1;
        *piVar1 = *piVar1 + 1;
      }
      *(byte *)&item->ItemFlags = (byte)item->ItemFlags | 4;
      return true;
    }
  }
  bVar2 = APowerup::HandlePickup(&this->super_APowerup,item);
  return bVar2;
}

Assistant:

bool APowerInvisibility::HandlePickup (AInventory *item)
{
	if (Mode == NAME_Cumulative && ((Strength * special1) < 1.) && item->GetClass() == GetClass())
	{
		APowerup *power = static_cast<APowerup *>(item);
		if (power->EffectTics == 0)
		{
			power->ItemFlags |= IF_PICKUPGOOD;
			return true;
		}
		// Only increase the EffectTics, not decrease it.
		// Color also gets transferred only when the new item has an effect.
		if (power->EffectTics > EffectTics)
		{
			EffectTics = power->EffectTics;
			BlendColor = power->BlendColor;
		}
		special1++;	// increases power
		power->ItemFlags |= IF_PICKUPGOOD;
		return true;
	}
	return Super::HandlePickup (item);
}